

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O3

U32 duckdb_zstd::ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  uint uVar1;
  int iVar2;
  U32 UVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,litLength);
  UVar3 = 0x800;
  if (((int)plVar5[0xc] != 2) && (UVar3 = 0x600, (int)plVar5[10] != 1)) {
    uVar1 = (int)plVar5[8] - 0x100;
    uVar4 = *(int *)(*plVar5 + (ulong)*literals * 4) + 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    if ((int)optPtr == 0) {
      uVar4 = iVar2 << 8;
    }
    else {
      uVar4 = (uVar4 * 0x100 >> ((byte)iVar2 & 0x1f)) + iVar2 * 0x100;
    }
    if (uVar1 < uVar4) {
      uVar4 = uVar1;
    }
    UVar3 = (int)plVar5[8] - uVar4;
  }
  return UVar3;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr,
                                int optLevel)
{
    DEBUGLOG(8, "ZSTD_rawLiteralsCost (%u literals)", litLength);
    if (litLength == 0) return 0;

    if (!ZSTD_compressedLiterals(optPtr))
        return (litLength << 3) * BITCOST_MULTIPLIER;  /* Uncompressed - 8 bytes per literal. */

    if (optPtr->priceType == zop_predef)
        return (litLength*6) * BITCOST_MULTIPLIER;  /* 6 bit per literal - no statistic used */

    /* dynamic statistics */
    {   U32 price = optPtr->litSumBasePrice * litLength;
        U32 const litPriceMax = optPtr->litSumBasePrice - BITCOST_MULTIPLIER;
        U32 u;
        assert(optPtr->litSumBasePrice >= BITCOST_MULTIPLIER);
        for (u=0; u < litLength; u++) {
            U32 litPrice = WEIGHT(optPtr->litFreq[literals[u]], optLevel);
            if (UNLIKELY(litPrice > litPriceMax)) litPrice = litPriceMax;
            price -= litPrice;
        }
        return price;
    }
}